

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O3

void PoolFreeEmptyPages(MemoryPool *pool)

{
  int *piVar1;
  AddressRange *pAVar2;
  size_t sVar3;
  int iVar4;
  size_t nb;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  Page *pacVar12;
  Page *pacVar13;
  ulong uVar14;
  ulong number;
  ulong uVar15;
  ulong uVar16;
  Page *base;
  Page *pacVar17;
  
  pvVar5 = pthread_getspecific(tsdKey);
  sVar3 = systemPageSize;
  pacVar13 = (Page *)0x0;
  pool->nbPages = 0;
  pool->nbSetCells = 0;
  if (pool->pages != (Page *)0x0) {
    uVar8 = sVar3 >> 0xc;
    pacVar13 = (Page *)0x0;
    base = pool->pages;
    do {
      uVar16 = 0;
      uVar15 = 0;
      pacVar17 = base;
      do {
        pacVar12 = pacVar17;
        lVar9 = 0x10;
        lVar6 = 0;
        do {
          lVar6 = lVar6 + ""[*(byte *)((long)*pacVar12 + lVar9)];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x20);
        uVar15 = uVar15 + 1;
        uVar16 = uVar16 + lVar6;
        pacVar17 = (Page *)(*(ulong *)*pacVar12 & 0xffffffffffffff00);
      } while ((*(ulong *)*pacVar12 & 0x20) == 0);
      if (uVar15 < uVar16) {
        if (-1 < *(char *)((long)*pacVar12 + 0x1f)) {
          pvVar7 = pthread_getspecific(tsdKey);
          iVar4 = *(int *)((long)pvVar7 + 0x460);
          *(int *)((long)pvVar7 + 0x460) = iVar4 + 1;
          pAVar2 = ranges;
          if (iVar4 == 0) {
            pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
            pAVar2 = ranges;
          }
          for (; pAVar2 != (AddressRange *)0x0; pAVar2 = pAVar2->next) {
            pacVar13 = (Page *)pAVar2->base;
            if ((pacVar13 <= base) &&
               (base < (Page *)((long)*pacVar13 + (pAVar2->size << ((byte)shiftPage & 0x3f))))) {
              uVar11 = (long)base - (long)pacVar13 >> ((byte)shiftPage & 0x3f);
              uVar14 = (ulong)*(char *)((long)&pAVar2[1].next + uVar11);
              if (uVar14 == 0xffffffffffffffff) goto LAB_00106df7;
              number = ~uVar14;
              iVar4 = PlatFreePages((byte *)((long)*base + systemPageSize),number);
              if (iVar4 == 0) {
                pcVar10 = "Page deallocation failed";
                goto LAB_00106df0;
              }
              *(undefined1 *)((long)&pAVar2[1].next + uVar11) = 0xff;
              if (uVar11 + 1 < uVar11 - uVar14) {
                memset((void *)((long)&pAVar2[1].next + uVar11 + 1),0,number);
              }
              pAVar2->free = pAVar2->free + number;
              if (uVar11 < pAVar2->first) {
                pAVar2->first = uVar11;
              }
              goto LAB_00106df7;
            }
          }
          pcVar10 = "Page not found";
LAB_00106df0:
          Col_Error(COL_FATAL,ColibriDomain,2,pcVar10);
LAB_00106df7:
          pvVar7 = pthread_getspecific(tsdKey);
          piVar1 = (int *)((long)pvVar7 + 0x460);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            pthread_mutex_unlock((pthread_mutex_t *)&mutexRange);
          }
          if (uVar15 < uVar8) {
            uVar11 = *(ulong *)*pacVar12 & 0xffffffffffffffdf;
            *(ulong *)*pacVar12 = uVar11;
            pacVar13 = pacVar12;
            do {
              pacVar13 = pacVar13 + 1;
              *(ulong *)*pacVar12 = (ulong)pacVar13 & 0xffffffffffffff00 | uVar11 & 0xff;
              uVar14 = (ulong)(pool->generation & 0xf);
              uVar11 = *(ulong *)pacVar12[1] & 0xffffffffffffff00 | uVar14;
              *(ulong *)pacVar12[1] = uVar11;
              *(ulong *)(pacVar12[1] + 8) = *(ulong *)((long)pvVar5 + 8);
              *(char *)((long)(pacVar12 + 1) + 0x11) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x12) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x13) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x14) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x15) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x16) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x17) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x18) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x18) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x19) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x1a) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x1b) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x1c) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x1d) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x1e) = '\0';
              *(char *)((long)(pacVar12 + 1) + 0x1f) = '\0';
              pacVar12[1][0x10] = 1;
              pacVar12 = pacVar12 + 1;
              uVar15 = uVar15 + 1;
              uVar16 = uVar16 + 1;
            } while (uVar15 < uVar8);
            *(byte **)*pacVar12 = (byte *)((long)*pacVar17 + uVar14 + 0x20);
            uVar15 = uVar8;
          }
        }
        pool->nbPages = pool->nbPages + uVar15;
        pool->nbSetCells = pool->nbSetCells + uVar16;
        pacVar13 = pacVar12;
      }
      else {
        if (pacVar13 == (Page *)0x0) {
          pool->pages = pacVar17;
        }
        else {
          *(ulong *)*pacVar13 = (ulong)(byte)(*pacVar13)[0] | (ulong)pacVar17;
        }
        SysPageFree(base);
      }
      base = pacVar17;
    } while (pacVar17 != (Page *)0x0);
  }
  pool->lastPage = pacVar13;
  return;
}

Assistant:

void
PoolFreeEmptyPages(
    MemoryPool *pool)   /*!< Pool with pages to free. */
{
    ThreadData *data = PlatGetThreadData();
    Page *page, *base, *prev, *next;
    const size_t nbPagesPerSysPage = systemPageSize/PAGE_SIZE;
    size_t nbSetCells, nbPages, i;

    pool->nbPages = 0;
    pool->nbSetCells = 0;

    /*
     * Iterate over system pages...
     */

    for (prev = NULL, base = pool->pages; base; base = next) {
        /*
         * ... then over logical pages within the system page.
         */

        nbPages = 0;
        nbSetCells = 0;
        ASSERT(PAGE_FLAG(base, PAGE_FLAG_FIRST));
        for (page = base; ; page = PAGE_NEXT(page)) {
            nbPages++;
            nbSetCells += NbSetCells(page);
            if (PAGE_FLAG(page, PAGE_FLAG_LAST)) break;
        }
        next = PAGE_NEXT(page);
        if (nbSetCells > RESERVED_CELLS * nbPages) {
            /*
             * At least one page contains allocated cells.
             */

            if (!TestCell(page, CELLS_PER_PAGE-1)) {
                /*
                 * If there was a trailing large cell group, it is unused now.
                 */

                SysPageTrim(base);

                if (nbPages < nbPagesPerSysPage) {
                    /*
                     * Rebuild & relink logical pages that were used by the
                     * trailing cells.
                     */

                    PAGE_CLEAR_FLAG(page, PAGE_FLAG_LAST);
                    for (i = nbPages; i < nbPagesPerSysPage; i++) {
                        PAGE_SET_NEXT(page, page+1);
                        page++;

                        PAGE_SET_GENERATION(page, pool->generation);
                        PAGE_CLEAR_FLAG(page, PAGE_FLAGS_MASK);
                        PAGE_GROUPDATA(page) = data->groupData;

                        /* Initialize bit mask for allocated cells. */
                        ClearAllCells(page);

                        nbPages++;
                        nbSetCells++;
                    }
                    PAGE_SET_FLAG(page, PAGE_FLAG_LAST);
                    PAGE_SET_NEXT(page, next);
                }
            }
            prev = page;
            pool->nbPages += nbPages;
            pool->nbSetCells += nbSetCells;
        } else {
            /*
             * All logical pages in system page are empty.
             */

            if (prev) {
                /*
                 * Middle of list.
                 */

                PAGE_SET_NEXT(prev, next);
            } else {
                /*
                 * Head of list.
                 */

                pool->pages = next;
            }

            /*
             * Free the system page.
             */

            SysPageFree(base);
        }
    }
    ASSERT(!prev||!PAGE_NEXT(prev));
    pool->lastPage = prev;
}